

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.h
# Opt level: O0

int __thiscall
Js::ConcatStringMulti::GetRandomAccessItemsFromConcatString
          (ConcatStringMulti *this,JavascriptString ***items)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ValueType *ppJVar4;
  JavascriptString ***items_local;
  ConcatStringMulti *this_local;
  
  bVar2 = IsFilled(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/ConcatString.h"
                                ,0x105,"(IsFilled())","IsFilled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ppJVar4 = Memory::AddressOf<Memory::WriteBarrierPtr<Js::JavascriptString>>
                      ((WriteBarrierPtr<Js::JavascriptString> *)(this + 1));
  *items = ppJVar4;
  return this->slotCount;
}

Assistant:

virtual int GetRandomAccessItemsFromConcatString(Js::JavascriptString * const *& items) const
        {
            Assert(IsFilled());
            items = AddressOf(m_slots[0]);
            return slotCount;
        }